

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O1

size_t wasm::FunctionHasher::hashFunction(Function *func)

{
  size_t sVar1;
  ExprHasher local_38;
  
  local_38.super__Function_base._M_functor._8_8_ = 0;
  local_38.super__Function_base._M_functor._M_unused._M_function_pointer =
       ExpressionAnalyzer::nothingHasher;
  local_38._M_invoker =
       std::
       _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_bool_(*)(wasm::Expression_*,_unsigned_long_&)>
       ::_M_invoke;
  local_38.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_bool_(*)(wasm::Expression_*,_unsigned_long_&)>
       ::_M_manager;
  sVar1 = flexibleHashFunction(func,&local_38);
  if (local_38.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_38.super__Function_base._M_manager)
              ((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  return sVar1;
}

Assistant:

static size_t hashFunction(Function* func) {
    return flexibleHashFunction(func, ExpressionAnalyzer::nothingHasher);
  }